

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::(anonymous_namespace)::PrintShortTextFormat_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Message *message)

{
  Printer printer;
  Printer local_80;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::Printer(&local_80);
  local_80.single_line_mode_ = true;
  local_80.expand_any_ = true;
  TextFormat::Printer::PrintToString(&local_80,(Message *)this,__return_storage_ptr__);
  if ((__return_storage_ptr__->_M_string_length != 0) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      ' ')) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  TextFormat::Printer::~Printer(&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintShortTextFormat(const google::protobuf::Message& message) {
  std::string debug_string;

  google::protobuf::TextFormat::Printer printer;
  printer.SetSingleLineMode(true);
  printer.SetExpandAny(true);

  printer.PrintToString(message, &debug_string);
  // Single line mode currently might have an extra space at the end.
  if (!debug_string.empty() && debug_string[debug_string.size() - 1] == ' ') {
    debug_string.resize(debug_string.size() - 1);
  }

  return debug_string;
}